

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.hpp
# Opt level: O0

file_handle_type
mio::detail::open_file<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path,access_mode mode,
          error_code *error)

{
  bool bVar1;
  type *__file;
  int __oflag;
  error_code eVar2;
  undefined4 uStack_4c;
  int handle;
  error_code *error_local;
  access_mode mode_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path_local;
  
  std::error_code::clear(error);
  bVar1 = empty<std::__cxx11::string,bool,void>(path);
  if (bVar1) {
    eVar2 = std::make_error_code(invalid_argument);
    *(ulong *)error = CONCAT44(handle,eVar2._M_value);
    error->_M_cat = eVar2._M_cat;
    path_local._4_4_ = -1;
  }
  else {
    __file = c_str<std::__cxx11::string,char*,void>(path);
    __oflag = 2;
    if (mode == read) {
      __oflag = 0;
    }
    path_local._4_4_ = open(__file,__oflag);
    if (path_local._4_4_ == -1) {
      eVar2 = last_error();
      *(ulong *)error = CONCAT44(uStack_4c,eVar2._M_value);
      error->_M_cat = eVar2._M_cat;
    }
  }
  return path_local._4_4_;
}

Assistant:

file_handle_type open_file(const String& path, const access_mode mode,
        std::error_code& error)
{
    error.clear();
    if(detail::empty(path))
    {
        error = std::make_error_code(std::errc::invalid_argument);
        return invalid_handle;
    }
#ifdef _WIN32
    const auto handle = win::open_file_helper(path, mode);
#else // POSIX
    const auto handle = ::open(c_str(path),
            mode == access_mode::read ? O_RDONLY : O_RDWR);
#endif
    if(handle == invalid_handle)
    {
        error = detail::last_error();
    }
    return handle;
}